

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileCopier.cxx
# Opt level: O3

bool __thiscall
cmFileCopier::InstallFile
          (cmFileCopier *this,string *fromFile,string *toFile,MatchProperties match_properties)

{
  char *pcVar1;
  cmCommand *pcVar2;
  bool bVar3;
  size_t sVar4;
  ostream *poVar5;
  mode_t perm;
  mode_t permissions;
  undefined1 auStack_1c8 [4];
  mode_t local_1c4;
  string local_1c0;
  undefined1 local_1a0 [376];
  
  if (this->Always == true) {
    (*this->_vptr_cmFileCopier[4])(this,toFile,0,1);
  }
  else {
    bVar3 = cmFileTimeCache::DifferS(&this->FileTimes,fromFile,toFile);
    (*this->_vptr_cmFileCopier[4])(this,toFile,0,(ulong)bVar3);
    if (!bVar3) goto LAB_002da7e7;
  }
  bVar3 = cmsys::SystemTools::CopyAFile(fromFile,toFile,true);
  if (bVar3) {
    if (this->Always == false) {
      local_1c4 = 0;
      bVar3 = cmsys::SystemTools::GetPermissions(toFile,&local_1c4);
      if (bVar3) {
        cmsys::SystemTools::SetPermissions(toFile,local_1c4 | 0x80,false);
      }
      bVar3 = cmFileTimes::Copy(fromFile,toFile);
      if (!bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
        pcVar1 = this->Name;
        if (pcVar1 == (char *)0x0) {
          std::ios::clear((int)auStack_1c8 +
                          (int)*(undefined8 *)(CONCAT44(local_1a0._4_4_,local_1a0._0_4_) + -0x18) +
                          0x28);
        }
        else {
          sVar4 = strlen(pcVar1);
          std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar1,sVar4);
        }
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a0," cannot set modification time on \"",0x22);
        poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                           ((ostream *)local_1a0,(toFile->_M_dataplus)._M_p,toFile->_M_string_length
                           );
        std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\"",1);
        pcVar2 = &this->FileCommand->super_cmCommand;
        std::__cxx11::stringbuf::str();
        cmCommand::SetError(pcVar2,&local_1c0);
        goto LAB_002da995;
      }
    }
LAB_002da7e7:
    local_1a0._0_4_ = match_properties.Permissions;
    if ((ulong)match_properties >> 0x20 == 0) {
      local_1a0._0_4_ = this->FilePermissions;
    }
    if (local_1a0._0_4_ == 0) {
      cmsys::SystemTools::GetPermissions(fromFile,(mode_t *)local_1a0);
    }
    bVar3 = SetPermissions(this,toFile,local_1a0._0_4_);
    return bVar3;
  }
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a0);
  pcVar1 = this->Name;
  if (pcVar1 == (char *)0x0) {
    std::ios::clear((int)auStack_1c8 +
                    (int)*(undefined8 *)(CONCAT44(local_1a0._4_4_,local_1a0._0_4_) + -0x18) + 0x28);
  }
  else {
    sVar4 = strlen(pcVar1);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a0,pcVar1,sVar4);
  }
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a0," cannot copy file \"",0x13);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)local_1a0,(fromFile->_M_dataplus)._M_p,fromFile->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\" to \"",6);
  poVar5 = std::__ostream_insert<char,std::char_traits<char>>
                     (poVar5,(toFile->_M_dataplus)._M_p,toFile->_M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar5,"\".",2);
  pcVar2 = &this->FileCommand->super_cmCommand;
  std::__cxx11::stringbuf::str();
  cmCommand::SetError(pcVar2,&local_1c0);
LAB_002da995:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1c0._M_dataplus._M_p != &local_1c0.field_2) {
    operator_delete(local_1c0._M_dataplus._M_p,local_1c0.field_2._M_allocated_capacity + 1);
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a0);
  std::ios_base::~ios_base((ios_base *)(local_1a0 + 0x70));
  return false;
}

Assistant:

bool cmFileCopier::InstallFile(const std::string& fromFile,
                               const std::string& toFile,
                               MatchProperties match_properties)
{
  // Determine whether we will copy the file.
  bool copy = true;
  if (!this->Always) {
    // If both files exist with the same time do not copy.
    if (!this->FileTimes.DifferS(fromFile, toFile)) {
      copy = false;
    }
  }

  // Inform the user about this file installation.
  this->ReportCopy(toFile, TypeFile, copy);

  // Copy the file.
  if (copy && !cmSystemTools::CopyAFile(fromFile, toFile, true)) {
    std::ostringstream e;
    e << this->Name << " cannot copy file \"" << fromFile << "\" to \""
      << toFile << "\".";
    this->FileCommand->SetError(e.str());
    return false;
  }

  // Set the file modification time of the destination file.
  if (copy && !this->Always) {
    // Add write permission so we can set the file time.
    // Permissions are set unconditionally below anyway.
    mode_t perm = 0;
    if (cmSystemTools::GetPermissions(toFile, perm)) {
      cmSystemTools::SetPermissions(toFile, perm | mode_owner_write);
    }
    if (!cmFileTimes::Copy(fromFile, toFile)) {
      std::ostringstream e;
      e << this->Name << " cannot set modification time on \"" << toFile
        << "\"";
      this->FileCommand->SetError(e.str());
      return false;
    }
  }

  // Set permissions of the destination file.
  mode_t permissions =
    (match_properties.Permissions ? match_properties.Permissions
                                  : this->FilePermissions);
  if (!permissions) {
    // No permissions were explicitly provided but the user requested
    // that the source file permissions be used.
    cmSystemTools::GetPermissions(fromFile, permissions);
  }
  return this->SetPermissions(toFile, permissions);
}